

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O0

idx_t duckdb::TemplatedMatch<true,bool,duckdb::DistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  bool bVar1;
  long in_RSI;
  Vector *in_stack_00000070;
  TupleDataLayout *in_stack_00000078;
  idx_t in_stack_00000080;
  SelectionVector *in_stack_00000088;
  TupleDataVectorFormat *in_stack_00000090;
  SelectionVector *in_stack_000000a0;
  idx_t *in_stack_000000a8;
  undefined8 local_8;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                    ((TemplatedValidityMask<unsigned_long> *)(in_RSI + 0x30));
  if (bVar1) {
    local_8 = TemplatedMatchLoop<true,bool,duckdb::DistinctFrom,true>
                        (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
                         in_stack_00000070,(idx_t)no_match_count,in_stack_000000a0,in_stack_000000a8
                        );
  }
  else {
    local_8 = TemplatedMatchLoop<true,bool,duckdb::DistinctFrom,false>
                        (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
                         in_stack_00000070,(idx_t)no_match_count,in_stack_000000a0,in_stack_000000a8
                        );
  }
  return local_8;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}